

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_encoder.c
# Opt level: O2

lzma_ret delta_encode(void *coder_ptr,lzma_allocator *allocator,uint8_t *in,size_t *in_pos,
                     size_t in_size,uint8_t *out,size_t *out_pos,size_t out_size,lzma_action action)

{
  byte bVar1;
  byte bVar2;
  uint8_t uVar3;
  char cVar4;
  size_t sVar5;
  lzma_ret lVar6;
  ulong uVar7;
  size_t i;
  ulong uVar8;
  size_t sVar9;
  
  if (*(code **)((long)coder_ptr + 0x18) == (code *)0x0) {
    sVar9 = *in_pos;
    sVar5 = *out_pos;
    uVar7 = out_size - sVar5;
    if (in_size - sVar9 < out_size - sVar5) {
      uVar7 = in_size - sVar9;
    }
    bVar1 = *(byte *)((long)coder_ptr + 0x48);
    for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      bVar2 = *(byte *)((long)coder_ptr + 0x50);
      uVar3 = in[uVar8 + sVar9];
      cVar4 = *(char *)((long)coder_ptr + (ulong)((uint)bVar2 + (uint)bVar1 & 0xff) + 0x51);
      *(byte *)((long)coder_ptr + 0x50) = bVar2 - 1;
      *(uint8_t *)((long)coder_ptr + (ulong)bVar2 + 0x51) = uVar3;
      out[uVar8 + sVar5] = uVar3 - cVar4;
    }
    *in_pos = sVar9 + uVar7;
    *out_pos = sVar5 + uVar7;
    lVar6 = LZMA_OK;
    if (action != LZMA_RUN) {
      lVar6 = (lzma_ret)(sVar9 + uVar7 == in_size);
    }
  }
  else {
    sVar9 = *out_pos;
    lVar6 = (**(code **)((long)coder_ptr + 0x18))(*coder_ptr);
    sVar5 = *out_pos;
    bVar1 = *(byte *)((long)coder_ptr + 0x48);
    for (; sVar5 != sVar9; sVar9 = sVar9 + 1) {
      bVar2 = *(byte *)((long)coder_ptr + 0x50);
      uVar3 = out[sVar9];
      cVar4 = *(char *)((long)coder_ptr + (ulong)((uint)bVar2 + (uint)bVar1 & 0xff) + 0x51);
      *(byte *)((long)coder_ptr + 0x50) = bVar2 - 1;
      *(uint8_t *)((long)coder_ptr + (ulong)bVar2 + 0x51) = uVar3;
      out[sVar9] = uVar3 - cVar4;
    }
  }
  return lVar6;
}

Assistant:

static lzma_ret
delta_encode(void *coder_ptr, const lzma_allocator *allocator,
		const uint8_t *restrict in, size_t *restrict in_pos,
		size_t in_size, uint8_t *restrict out,
		size_t *restrict out_pos, size_t out_size, lzma_action action)
{
	lzma_delta_coder *coder = coder_ptr;

	lzma_ret ret;

	if (coder->next.code == NULL) {
		const size_t in_avail = in_size - *in_pos;
		const size_t out_avail = out_size - *out_pos;
		const size_t size = my_min(in_avail, out_avail);

		copy_and_encode(coder, in + *in_pos, out + *out_pos, size);

		*in_pos += size;
		*out_pos += size;

		ret = action != LZMA_RUN && *in_pos == in_size
				? LZMA_STREAM_END : LZMA_OK;

	} else {
		const size_t out_start = *out_pos;

		ret = coder->next.code(coder->next.coder, allocator,
				in, in_pos, in_size, out, out_pos, out_size,
				action);

		encode_in_place(coder, out + out_start, *out_pos - out_start);
	}

	return ret;
}